

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O2

bool __thiscall
MeCab::RewritePattern::rewrite(RewritePattern *this,size_t size,char **input,string *output)

{
  _Alloc_hider __s1;
  char *__s2;
  char **ppcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *__dest;
  size_t sVar5;
  ostream *poVar6;
  size_t __n;
  pointer pbVar7;
  long lVar8;
  byte *pbVar9;
  char cVar10;
  size_t i;
  size_t sVar11;
  ulong uVar12;
  pointer pbVar13;
  byte *pbVar14;
  die local_99;
  ulong local_98;
  RewritePattern *local_90;
  scoped_fixed_array<char_*,_8192> col;
  scoped_fixed_array<char,_8192> buf;
  
  pbVar7 = (this->spat_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar13 = (this->spat_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (size < (ulong)((long)pbVar13 - (long)pbVar7 >> 5)) {
LAB_00166684:
    bVar2 = false;
  }
  else {
    local_90 = this;
    for (local_98 = 0; local_98 < (ulong)((long)pbVar13 - (long)pbVar7 >> 5);
        local_98 = local_98 + 1) {
      __s1._M_p = pbVar7[local_98]._M_dataplus._M_p;
      cVar10 = *__s1._M_p;
      if (cVar10 != '*') {
        __s2 = input[local_98];
        iVar3 = strcmp(__s1._M_p,__s2);
        if (iVar3 != 0) {
          sVar4 = strlen(__s1._M_p);
          if (cVar10 != '(') {
            return false;
          }
          if (sVar4 < 3) {
            return false;
          }
          if (__s1._M_p[sVar4 - 1] != ')') goto LAB_00166684;
          buf._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0019ed28;
          __dest = (char *)operator_new__(0x2000);
          buf.size_ = 0x2000;
          col._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0019ef10;
          buf.ptr_ = __dest;
          col.ptr_ = (char **)operator_new__(0x10000);
          col.size_ = 0x2000;
          if (sVar4 < 0x1ffd) {
            __n = 0x2000;
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                                    );
            poVar6 = std::operator<<(poVar6,"(");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2e);
            poVar6 = std::operator<<(poVar6,") [");
            poVar6 = std::operator<<(poVar6,"len < buf.size() - 3");
            poVar6 = std::operator<<(poVar6,"] ");
            std::operator<<(poVar6,"too long parameter");
            die::~die(&local_99);
            __n = buf.size_;
            __dest = buf.ptr_;
          }
          strncpy(__dest,__s1._M_p + 1,__n);
          buf.ptr_[sVar4 - 2] = '\0';
          sVar5 = tokenize<char**>(buf.ptr_,"|",col.ptr_,col.size_);
          if (col.size_ <= sVar5) {
            poVar6 = std::operator<<((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                                    );
            poVar6 = std::operator<<(poVar6,"(");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x32);
            poVar6 = std::operator<<(poVar6,") [");
            poVar6 = std::operator<<(poVar6,"n < col.size()");
            poVar6 = std::operator<<(poVar6,"] ");
            std::operator<<(poVar6,"too long OR nodes");
            die::~die(&local_99);
          }
          ppcVar1 = col.ptr_;
          sVar11 = 0;
          do {
            if (sVar5 == sVar11) {
              scoped_fixed_array<char_*,_8192>::~scoped_fixed_array(&col);
              scoped_fixed_array<char,_8192>::~scoped_fixed_array(&buf);
              goto LAB_00166684;
            }
            iVar3 = strcmp(__s2,ppcVar1[sVar11]);
            sVar11 = sVar11 + 1;
          } while (iVar3 != 0);
          scoped_fixed_array<char_*,_8192>::~scoped_fixed_array(&col);
          scoped_fixed_array<char,_8192>::~scoped_fixed_array(&buf);
          pbVar7 = (local_90->spat_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar13 = (local_90->spat_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
    }
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
    uVar12 = 0;
    while (pbVar7 = (local_90->dpat_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar12 < (ulong)((long)(local_90->dpat_).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5)) {
      buf._vptr_scoped_fixed_array = (_func_int **)&buf.size_;
      buf.ptr_ = (char *)0x0;
      buf.size_ = buf.size_ & 0xffffffffffffff00;
      pbVar9 = (byte *)pbVar7[uVar12]._M_dataplus._M_p;
      pbVar14 = pbVar9 + pbVar7[uVar12]._M_string_length;
      local_98 = uVar12;
      for (; pbVar9 < pbVar14; pbVar9 = pbVar9 + 1) {
        cVar10 = (char)(string *)&buf;
        if (*pbVar9 == 0x24) {
          lVar8 = 0;
          while ((pbVar9 = pbVar9 + 1, pbVar9 < pbVar14 && ((byte)(*pbVar9 - 0x30) < 10))) {
            lVar8 = lVar8 * 10 + (ulong)*pbVar9 + -0x30;
          }
          if (size <= lVar8 - 1U) {
            poVar6 = std::operator<<((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                                    );
            poVar6 = std::operator<<(poVar6,"(");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x69);
            poVar6 = std::operator<<(poVar6,") [");
            poVar6 = std::operator<<(poVar6,"n > 0 && (n - 1) < size");
            poVar6 = std::operator<<(poVar6,"] ");
            poVar6 = std::operator<<(poVar6," out of range: [");
            poVar6 = std::operator<<(poVar6,(string *)
                                            ((local_90->dpat_).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar12));
            poVar6 = std::operator<<(poVar6,"] ");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            die::~die((die *)&col);
          }
          std::__cxx11::string::append((char *)&buf);
          if (pbVar9 < pbVar14) {
            std::__cxx11::string::push_back(cVar10);
          }
        }
        else {
          std::__cxx11::string::push_back(cVar10);
        }
      }
      bVar2 = escape_csv_element((string *)&buf);
      uVar12 = local_98;
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                                );
        poVar6 = std::operator<<(poVar6,"(");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x71);
        poVar6 = std::operator<<(poVar6,") [");
        poVar6 = std::operator<<(poVar6,"escape_csv_element(&elm)");
        std::operator<<(poVar6,"] ");
        die::~die((die *)&col);
      }
      std::__cxx11::string::append((string *)output);
      uVar12 = uVar12 + 1;
      if (uVar12 != (long)(local_90->dpat_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_90->dpat_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) {
        std::__cxx11::string::append((char *)output);
      }
      std::__cxx11::string::~string((string *)&buf);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool RewritePattern::rewrite(size_t size,
                             const char **input,
                             std::string *output) const {
  if (spat_.size() > size) return false;
  for (size_t i = 0; i < spat_.size(); ++i) {
    if (!match_rewrite_pattern(spat_[i].c_str(), input[i]))
      return false;
  }

  output->clear();
  for (size_t i = 0; i < dpat_.size(); ++i) {
    std::string elm;
    const char *begin = dpat_[i].c_str();
    const char *end = begin + dpat_[i].size();
    for (const char *p = begin; p < end; ++p) {
      if (*p == '$') {
        ++p;
        size_t n = 0;
        for (; p < end; ++p) {
          switch (*p) {
            case '0': case '1': case '2': case '3': case '4':
            case '5': case '6': case '7': case '8': case '9':
              n = 10 * n + (*p - '0');
              break;
            default:
              goto NEXT;
          }
        }
     NEXT:
        CHECK_DIE(n > 0 && (n - 1) < size)
            << " out of range: [" << dpat_[i] << "] " << n;
        elm += input[n - 1];
        if (p < end) elm += *p;
      } else {
        elm += *p;
      }
    }
    CHECK_DIE(escape_csv_element(&elm));
    *output += elm;
    if (i + 1 != dpat_.size()) *output += ",";
  }

  return true;
}